

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

Address * ot::commissioner::Address::FromString(Address *__return_storage_ptr__,string *aAddr)

{
  undefined1 local_40 [40];
  
  (__return_storage_ptr__->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Set((Error *)local_40,__return_storage_ptr__,aAddr);
  std::__cxx11::string::~string((string *)(local_40 + 8));
  if (local_40._0_4_ == kNone) {
    return __return_storage_ptr__;
  }
  abort();
}

Assistant:

Address Address::FromString(const std::string &aAddr)
{
    Address ret;

    SuccessOrDie(ret.Set(aAddr));
    return ret;
}